

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void __thiscall ON_MeshCache::ClearAllMeshes(ON_MeshCache *this,bool bDeleteMesh)

{
  ON_MeshCacheItem *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *p;
  ON_MeshCacheItem *next;
  ON_MeshCacheItem *memblock;
  
  memblock = this->m_impl;
  if (memblock != (ON_MeshCacheItem *)0x0) {
    this->m_impl = (ON_MeshCacheItem *)0x0;
    do {
      pOVar1 = memblock->m_next;
      if ((bDeleteMesh) &&
         (this_00 = (memblock->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,
         this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      onfree(memblock);
      memblock = pOVar1;
    } while (pOVar1 != (ON_MeshCacheItem *)0x0);
  }
  return;
}

Assistant:

void ON_MeshCache::ClearAllMeshes(bool bDeleteMesh)
{
  if ( 0 != m_impl )
  {
    ON_MeshCacheItem* next = m_impl;
    m_impl = nullptr;
    for (ON_MeshCacheItem* item = next; nullptr != item; item = next)
    {
      next = item->m_next;
      Internal_DeleteItem(item,bDeleteMesh);
    }
  }
}